

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_printModelImportingModelChildComponent_Test::
~Printer_printModelImportingModelChildComponent_Test
          (Printer_printModelImportingModelChildComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, printModelImportingModelChildComponent)
{
    auto parser = libcellml::Parser::create();
    auto modelContents = fileContents("importingModelChildComponent.cellml");
    auto model = parser->parseModel(modelContents);

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());

    auto printer = libcellml::Printer::create();
    auto serialisedModel = printer->printModel(model);

    EXPECT_EQ(modelContents, serialisedModel);
}